

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsRecruiter.cc
# Opt level: O3

void __thiscall
LongReadsRecruiter::simple_thread_reads(LongReadsRecruiter *this,int min_count,int min_bp)

{
  vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
  *this_00;
  vector<PerfectMatch,_std::allocator<PerfectMatch>_> *matches;
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pPVar4;
  long lVar5;
  pointer pvVar6;
  uint64_t uVar7;
  ulong uVar8;
  pointer ppVar9;
  LongReadsRecruiter *this_01;
  long lVar10;
  ulong uVar11;
  int64_t pstart;
  int64_t pend;
  long local_78;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_70;
  ulong local_58;
  vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
  *local_50;
  long local_48;
  pointer local_40;
  long local_38;
  
  this_00 = &this->read_threads;
  std::
  vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
  ::_M_erase_at_end(this_00,(this->read_threads).
                            super__Vector_base<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  this_01 = (LongReadsRecruiter *)
            (((long)(this->read_perfect_matches).
                    super__Vector_base<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->read_perfect_matches).
                    super__Vector_base<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_50 = this_00;
  std::
  vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
  ::resize(this_00,(size_type)this_01);
  pvVar6 = (this->read_perfect_matches).
           super__Vector_base<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(this->read_perfect_matches).
                         super__Vector_base<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3) *
                 -0x5555555555555555)) {
    uVar11 = 1;
    do {
      matches = pvVar6 + uVar11;
      find_all_valid_blocks(&local_70,this_01,matches,min_count,min_bp);
      local_40 = local_70.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (local_70.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_70.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_48 = uVar11 * 0x18;
        lVar10 = 0;
        ppVar9 = local_70.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_58 = uVar11;
        do {
          iVar1 = ppVar9->first;
          iVar2 = ppVar9->second;
          pPVar4 = (matches->super__Vector_base<PerfectMatch,_std::allocator<PerfectMatch>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar10 = ((long)pPVar4[iVar1].read_position - (long)pPVar4[iVar1].node_position) + lVar10;
          local_78 = lVar10;
          uVar7 = SequenceDistanceGraph::get_node_size(this->sdg,pPVar4[iVar1].node);
          lVar5 = local_78;
          local_38 = uVar7 + lVar10;
          pPVar4 = (matches->super__Vector_base<PerfectMatch,_std::allocator<PerfectMatch>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          iVar3 = pPVar4[iVar2].node_position;
          iVar2 = pPVar4[iVar2].read_position;
          this_01 = (LongReadsRecruiter *)(pPVar4 + iVar1);
          std::vector<NodePosition,std::allocator<NodePosition>>::
          emplace_back<long_const&,long&,long&>
                    ((vector<NodePosition,std::allocator<NodePosition>> *)
                     ((long)&(((local_50->
                               super__Vector_base<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<NodePosition,_std::allocator<NodePosition>_>).
                             _M_impl.super__Vector_impl_data + local_48),(long *)this_01,&local_78,
                     &local_38);
          lVar10 = (lVar5 + iVar3) - (long)iVar2;
          ppVar9 = ppVar9 + 1;
          uVar11 = local_58;
        } while (ppVar9 != local_40);
      }
      if (local_70.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        this_01 = (LongReadsRecruiter *)
                  ((long)local_70.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_70.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        operator_delete(local_70.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,(ulong)this_01);
      }
      uVar11 = uVar11 + 1;
      pvVar6 = (this->read_perfect_matches).
               super__Vector_base<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->read_perfect_matches).
                     super__Vector_base<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3) *
              -0x5555555555555555;
    } while (uVar11 <= uVar8 && uVar8 - uVar11 != 0);
  }
  return;
}

Assistant:

void LongReadsRecruiter::simple_thread_reads(int min_count,int min_bp) {
    read_threads.clear();
    read_threads.resize(read_perfect_matches.size());
    for (auto rid=1;rid<read_perfect_matches.size();++rid){
        int64_t thread_offset=0;//offset between thread and read, computed on last block's position vs. its last match
        const auto & matches=read_perfect_matches[rid];
        for (auto nb:find_all_valid_blocks(matches,min_count,min_bp)) {
            int64_t pstart=matches[nb.first].read_position-matches[nb.first].node_position+thread_offset;
            int64_t pend=pstart+sdg.get_node_size(matches[nb.first].node);
            thread_offset=pstart+matches[nb.second].node_position-matches[nb.second].read_position;
            read_threads[rid].emplace_back(matches[nb.first].node, pstart, pend);
        }
    }
}